

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcTokenizer::stringize_macro_actual
          (CTcTokenizer *this,CTcTokString *expbuf,char *actual_val,size_t actual_len,
          char quote_char,int add_open_quote,int add_close_quote)

{
  bool bVar1;
  long *plVar2;
  wchar_t wVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  long in_RCX;
  char *in_RDX;
  long *in_RSI;
  char in_R8B;
  int in_R9D;
  int in_stack_00000008;
  wchar_t cur;
  wchar_t prvch;
  wchar_t inner_quote_char;
  int in_inner_quote;
  char *start;
  utf8_ptr src;
  utf8_ptr *in_stack_ffffffffffffff90;
  wchar_t local_44;
  wchar_t local_40;
  char *local_38;
  utf8_ptr local_30;
  int local_28;
  char local_21;
  long local_20;
  char *local_18;
  long *local_10;
  
  local_28 = in_R9D;
  local_21 = in_R8B;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  utf8_ptr::utf8_ptr(&local_30);
  if (local_28 != 0) {
    (**(code **)(*local_10 + 0x20))(local_10,&local_21,1);
  }
  local_38 = local_18;
  utf8_ptr::set(&local_30,local_18);
  bVar1 = false;
  local_40 = L'\0';
  local_44 = L'\0';
  do {
    while( true ) {
      pcVar5 = utf8_ptr::getptr(&local_30);
      if (local_18 + local_20 <= pcVar5) {
        pcVar5 = utf8_ptr::getptr(&local_30);
        plVar2 = local_10;
        if (local_38 < pcVar5) {
          pcVar5 = local_38;
          pcVar6 = utf8_ptr::getptr(&local_30);
          (**(code **)(*plVar2 + 0x20))(plVar2,pcVar5,(long)pcVar6 - (long)local_38);
        }
        if (in_stack_00000008 != 0) {
          (**(code **)(*local_10 + 0x20))(local_10,&local_21,1);
        }
        return;
      }
      wVar3 = utf8_ptr::getch((utf8_ptr *)0x2ee5fa);
      iVar4 = is_space(L'\0');
      if ((iVar4 != 0) && (local_44 != L'\\')) break;
      if ((wVar3 == local_21) || ((wVar3 == L'\\' && (bVar1)))) {
        pcVar5 = utf8_ptr::getptr(&local_30);
        plVar2 = local_10;
        if (local_38 < pcVar5) {
          pcVar5 = utf8_ptr::getptr(&local_30);
          (**(code **)(*plVar2 + 0x20))(plVar2,local_38,(long)pcVar5 - (long)local_38);
        }
        (**(code **)(*local_10 + 0x20))(local_10,"\\",1);
        local_38 = utf8_ptr::getptr(&local_30);
      }
      if (local_44 != L'\\') {
        if ((bVar1) && (wVar3 == local_40)) {
          bVar1 = false;
        }
        else if ((!bVar1) && ((wVar3 == L'\"' || (wVar3 == L'\'')))) {
          bVar1 = true;
          local_40 = wVar3;
        }
      }
      utf8_ptr::inc(in_stack_ffffffffffffff90);
      local_44 = wVar3;
    }
    pcVar5 = utf8_ptr::getptr(&local_30);
    plVar2 = local_10;
    if (local_38 < pcVar5) {
      pcVar5 = utf8_ptr::getptr(&local_30);
      (**(code **)(*plVar2 + 0x20))(plVar2,local_38,(long)pcVar5 - (long)local_38);
    }
    while (pcVar5 = utf8_ptr::getptr(&local_30), pcVar5 < local_18 + local_20) {
      utf8_ptr::getch((utf8_ptr *)0x2ee68a);
      iVar4 = is_space(L'\0');
      if (iVar4 == 0) break;
      utf8_ptr::inc(in_stack_ffffffffffffff90);
    }
    if ((local_44 != L'\0') && (pcVar5 = utf8_ptr::getptr(&local_30), pcVar5 < local_18 + local_20))
    {
      (**(code **)(*local_10 + 0x20))(local_10," ",1);
    }
    local_38 = utf8_ptr::getptr(&local_30);
    local_44 = wVar3;
  } while( true );
}

Assistant:

void CTcTokenizer::stringize_macro_actual(CTcTokString *expbuf,
                                          const char *actual_val,
                                          size_t actual_len, char quote_char,
                                          int add_open_quote,
                                          int add_close_quote)
{
    utf8_ptr src;
    const char *start;
    int in_inner_quote;
    wchar_t inner_quote_char;
    wchar_t prvch;
    
    /* add the open quote if desired */
    if (add_open_quote)
        expbuf->append(&quote_char, 1);

    /* remember the start of the current segment */
    start = actual_val;
    
    /* 
     *   add the characters of the actual parameter value, quoting any
     *   quotes or backslashes 
     */
    for (src.set((char *)actual_val),
         in_inner_quote = FALSE, inner_quote_char = '\0', prvch = '\0' ;
         src.getptr() < actual_val + actual_len ; )
    {
        wchar_t cur;

        /* get this character */
        cur = src.getch();

        /* compress runs of whitespace to single spaces */
        if (is_space(cur) && prvch != '\\')
        {
            /* append up to this character */
            if (src.getptr() > start)
                expbuf->append(start, src.getptr() - start);

            /* find the next non-space character */
            for ( ; src.getptr() < actual_val + actual_len ; src.inc())
            {
                if (!is_space(src.getch()))
                    break;
            }

            /* 
             *   if we're not at the start or end of the string, add a
             *   single space to replace the entire run of whitespace --
             *   don't do this at the start or end of the string, since
             *   we must remove leading and trailing whitespace
             */
            if (prvch != '\0' && src.getptr() < actual_val + actual_len)
                expbuf->append(" ", 1);

            /* note that the previous character is a space */
            prvch = cur;

            /* this is the new starting point */
            start = src.getptr();

            /* proceed - we're already at the next character */
            continue;
        }

        /* 
         *   Check to see if we need to quote this character.  Quote any
         *   quote mark matching the enclosing quotes; also quote any
         *   backslash that occurs within nested quotes within the source
         *   material, but not backslashes that occur originally outside
         *   quotes.  
         */
        if (cur == quote_char
            || (cur == '\\' && in_inner_quote))
        {
            /* append the segment up to (but not including) this character */
            if (src.getptr() > start)
                expbuf->append(start, src.getptr() - start);
            
            /* add an extra backslash */
            expbuf->append("\\", 1);

            /* remember the start of the next segment */
            start = src.getptr();
        }

        /* 
         *   if this is a quote character, and it's not itself escaped,
         *   reverse our in-quote flag 
         */
        if (prvch != '\\')
        {
            /* 
             *   If we're in an inner quote, and it's a match for the open
             *   inner quote, we're no longer in a quote.  Otherwise, if
             *   we're not in quotes and this is some kind of quote, enter
             *   the new quotes.  
             */
            if (in_inner_quote && cur == inner_quote_char)
            {
                /* we're leaving the inner quoted string */
                in_inner_quote = FALSE;
            }
            else if (!in_inner_quote && (cur == '"' || cur == '\''))
            {
                /* we're entering a new inner quoted string */
                in_inner_quote = TRUE;
                inner_quote_char = cur;
            }
        }

        /* remember this as the previous character */
        prvch = cur;

        /* move on to the next character */
        src.inc();
    }

    /* if there's anything in the final segment, append it */
    if (src.getptr() > start)
        expbuf->append(start, src.getptr() - start);

    /* add the close quote if desired */
    if (add_close_quote)
        expbuf->append(&quote_char, 1);
}